

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

bool __thiscall Catch::Clara::Opt::isMatch(Opt *this,StringRef optToken)

{
  pointer pSVar1;
  pointer pSVar2;
  bool bVar3;
  pointer pSVar4;
  size_type extraout_RDX;
  StringRef *name;
  StringRef SVar6;
  StringRef optName;
  StringRef local_38;
  size_type sVar5;
  
  SVar6.m_size = (char *)optToken.m_size;
  SVar6.m_start = SVar6.m_size;
  SVar6 = anon_unknown.dwarf_1cebf9::normaliseOpt
                    ((anon_unknown_dwarf_1cebf9 *)optToken.m_start,SVar6);
  sVar5 = SVar6.m_size;
  pSVar1 = (this->m_optNames).
           super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pSVar2 = (this->m_optNames).
           super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    pSVar4 = pSVar2;
    if (pSVar4 == pSVar1) break;
    optName.m_size = sVar5;
    optName.m_start = (char *)pSVar4->m_size;
    local_38 = anon_unknown.dwarf_1cebf9::normaliseOpt
                         ((anon_unknown_dwarf_1cebf9 *)pSVar4->m_start,optName);
    bVar3 = StringRef::operator==(&local_38,SVar6);
    pSVar2 = pSVar4 + 1;
    sVar5 = extraout_RDX;
  } while (!bVar3);
  return pSVar4 != pSVar1;
}

Assistant:

bool Opt::isMatch(StringRef optToken) const {
            auto normalisedToken = normaliseOpt(optToken);
            for (auto const& name : m_optNames) {
                if (normaliseOpt(name) == normalisedToken)
                    return true;
            }
            return false;
        }